

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O0

void mergeSections(Section *sect,SectionType type,uint32_t org,uint32_t bank,uint8_t alignment,
                  uint16_t alignOffset,SectionModifier mod)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  code *local_40;
  uint local_24;
  uint nbSectErrors;
  uint16_t alignOffset_local;
  uint8_t alignment_local;
  uint32_t bank_local;
  uint32_t org_local;
  SectionType type_local;
  Section *sect_local;
  
  bVar3 = type != sect->type;
  if (bVar3) {
    error("Section already exists but with type %s\n",sectionTypeInfo[sect->type].name);
  }
  local_24 = (uint)bVar3;
  if (sect->modifier == mod) {
    if (mod == SECTION_NORMAL) {
      error("Section already defined previously at ");
      local_24 = local_24 + 1;
      fstk_Dump(sect->src,sect->fileLine);
      putc(10,_stderr);
    }
    else if (mod == SECTION_UNION || mod == SECTION_FRAGMENT) {
      if (mod == SECTION_UNION) {
        local_40 = mergeSectUnion;
      }
      else {
        local_40 = mergeFragments;
      }
      iVar1 = (*local_40)(sect,type,org,alignment,alignOffset);
      local_24 = iVar1 + local_24;
      if (sect->bank == 0xffffffff) {
        sect->bank = bank;
      }
      else if ((bank != 0xffffffff) && (sect->bank != bank)) {
        error("Section already declared with different bank %u\n",(ulong)sect->bank);
        local_24 = local_24 + 1;
      }
    }
  }
  else {
    error("Section already declared as %s section\n",sectionModNames[sect->modifier]);
    local_24 = local_24 + 1;
  }
  if (local_24 == 0) {
    return;
  }
  pcVar2 = "s";
  if (local_24 == 1) {
    pcVar2 = "";
  }
  fatalerror("Cannot create section \"%s\" (%u error%s)\n",sect->name,(ulong)local_24,pcVar2);
}

Assistant:

static void mergeSections(struct Section *sect, enum SectionType type, uint32_t org, uint32_t bank,
			  uint8_t alignment, uint16_t alignOffset, enum SectionModifier mod)
{
	unsigned int nbSectErrors = 0;

	if (type != sect->type)
		fail("Section already exists but with type %s\n", sectionTypeInfo[sect->type].name);

	if (sect->modifier != mod) {
		fail("Section already declared as %s section\n", sectionModNames[sect->modifier]);
	} else {
		switch (mod) {
		case SECTION_UNION:
		case SECTION_FRAGMENT:
			nbSectErrors += (mod == SECTION_UNION ? mergeSectUnion : mergeFragments)
						(sect, type, org, alignment, alignOffset);

			// Common checks

			// If the section's bank is unspecified, override it
			if (sect->bank == (uint32_t)-1)
				sect->bank = bank;
			// If both specify a bank, it must be the same one
			else if (bank != (uint32_t)-1 && sect->bank != bank)
				fail("Section already declared with different bank %" PRIu32 "\n",
				     sect->bank);
			break;

		case SECTION_NORMAL:
			fail("Section already defined previously at ");
			fstk_Dump(sect->src, sect->fileLine);
			putc('\n', stderr);
			break;
		}
	}

	if (nbSectErrors)
		fatalerror("Cannot create section \"%s\" (%u error%s)\n",
			   sect->name, nbSectErrors, nbSectErrors == 1 ? "" : "s");
}